

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall icu_63::DecimalFormat::setSignAlwaysShown(DecimalFormat *this,UBool value)

{
  DecimalFormatProperties *pDVar1;
  UBool value_local;
  DecimalFormat *this_local;
  
  pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  if ((int)value != (uint)(pDVar1->signAlwaysShown & 1)) {
    pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                       ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                        this->fields);
    pDVar1->signAlwaysShown = value != '\0';
    touchNoError(this);
  }
  return;
}

Assistant:

void DecimalFormat::setSignAlwaysShown(UBool value) {
    if (UBOOL_TO_BOOL(value) == fields->properties->signAlwaysShown) { return; }
    fields->properties->signAlwaysShown = value;
    touchNoError();
}